

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall front::irGenerator::irGenerator::irGenerator(irGenerator *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->_package).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ed4a8;
  p_Var1 = &(this->_package).functions._M_t._M_impl.super__Rb_tree_header;
  (this->_package).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_package).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->_package).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_package).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_package).functions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_package).global_values._M_t._M_impl.super__Rb_tree_header;
  (this->_package).global_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_package).global_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_package).global_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_package).global_values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_package).global_values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_InitStringId = 0;
  this->_InitLabelId = 0;
  this->_InitLocalVarId = 1;
  this->_InitTmpVarId = 0x8000;
  this->_VoidVarId = 0x100000;
  this->_ReturnBlockLabelId = 0x100000;
  this->_ReturnVarId = 0;
  (this->_GlobalInitFuncName)._M_dataplus._M_p = (pointer)&(this->_GlobalInitFuncName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_GlobalInitFuncName,"main","");
  (this->_VoidVarName)._M_dataplus._M_p = (pointer)&(this->_VoidVarName).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->_VoidVarName,"v_Compiler_Void_Var_Name_$$","");
  (this->_ReturnVarName)._M_dataplus._M_p = (pointer)&(this->_ReturnVarName).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->_ReturnVarName,"r__Compiler_Retuen_Var_Name__$$","");
  (this->_StringNamePrefix)._M_dataplus._M_p = (pointer)&(this->_StringNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_StringNamePrefix,"s_","");
  (this->_TmpNamePrefix)._M_dataplus._M_p = (pointer)&(this->_TmpNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_TmpNamePrefix,"t_","");
  (this->_ConstNamePrefix)._M_dataplus._M_p = (pointer)&(this->_ConstNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_ConstNamePrefix,"c_","");
  (this->_VarNamePrefix)._M_dataplus._M_p = (pointer)&(this->_VarNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_VarNamePrefix,"v_","");
  (this->_GenSaveParamVarNamePrefix)._M_dataplus._M_p =
       (pointer)&(this->_GenSaveParamVarNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->_GenSaveParamVarNamePrefix,"sp_","");
  (this->_FunctionNamePrefix)._M_dataplus._M_p = (pointer)&(this->_FunctionNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_FunctionNamePrefix,"f_","");
  p_Var1 = &(this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_whileStack).
  super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_whileStack).
  super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_whileStack).
  super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_funcStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_funcStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_funcStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_stringToName)._M_t._M_impl.super__Rb_tree_header;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

irGenerator::irGenerator() {}